

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-internal.h
# Opt level: O0

bool testing::internal::
     TypeParameterizedTest<WordSplitStringTest,_testing::internal::TemplateSel<WordSplitStringTest_single_word_long_Test>,_testing::internal::Types<wchar_t,_char8_t,_char16_t,_char32_t>_>
     ::Register(char *prefix,CodeLocation *code_location,char *case_name,char *test_names,int index,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *type_names)

{
  CodeLocation CVar1;
  bool bVar2;
  const_reference __rhs;
  char *pcVar3;
  char *pcVar4;
  _func_void *p_Var5;
  char *pcVar6;
  TestFactoryBase *pTVar7;
  SetUpTearDownSuiteFuncType p_Var8;
  TestFactoryImpl<WordSplitStringTest_single_word_long_Test<wchar_t>_> *this;
  char *pcVar9;
  char *str;
  CodeLocation local_178;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  string local_130;
  string local_110;
  allocator<char> local_d9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_38;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *type_names_local;
  internal *piStack_28;
  int index_local;
  char *test_names_local;
  char *case_name_local;
  CodeLocation *code_location_local;
  char *prefix_local;
  
  local_38 = type_names;
  type_names_local._4_4_ = index;
  piStack_28 = (internal *)test_names;
  test_names_local = case_name;
  case_name_local = (char *)code_location;
  code_location_local = (CodeLocation *)prefix;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_d8,prefix,&local_d9);
  pcVar9 = "/";
  if (*(char *)&(code_location_local->file)._M_dataplus._M_p == '\0') {
    pcVar9 = "";
  }
  std::operator+(&local_b8,&local_d8,pcVar9);
  std::operator+(&local_98,&local_b8,test_names_local);
  std::operator+(&local_78,&local_98,"/");
  __rhs = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::operator[](local_38,(long)type_names_local._4_4_);
  std::operator+(&local_58,&local_78,__rhs);
  pcVar9 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                     (&local_58);
  GetPrefixUntilComma_abi_cxx11_(&local_130,piStack_28,str);
  StripTrailingSpaces(&local_110,&local_130);
  pcVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                     (&local_110);
  GetTypeName<wchar_t>();
  pcVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                     (&local_150);
  CodeLocation::CodeLocation(&local_178,(CodeLocation *)case_name_local);
  p_Var5 = (_func_void *)GetTypeId<WordSplitStringTest<wchar_t>>();
  pcVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                     ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      case_name_local);
  pTVar7 = (TestFactoryBase *)
           SuiteApiResolver<WordSplitStringTest_single_word_long_Test<wchar_t>_>::
           GetSetUpCaseOrSuite(pcVar6,*(int *)(case_name_local + 0x20));
  pcVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                     ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      case_name_local);
  p_Var8 = SuiteApiResolver<WordSplitStringTest_single_word_long_Test<wchar_t>_>::
           GetTearDownCaseOrSuite(pcVar6,*(int *)(case_name_local + 0x20));
  this = (TestFactoryImpl<WordSplitStringTest_single_word_long_Test<wchar_t>_> *)operator_new(8);
  TestFactoryImpl<WordSplitStringTest_single_word_long_Test<wchar_t>_>::TestFactoryImpl(this);
  CVar1.file._M_string_length = (size_type)p_Var8;
  CVar1.file._M_dataplus._M_p = (pointer)pTVar7;
  CVar1.file.field_2._M_allocated_capacity = (size_type)this;
  CVar1.file.field_2._8_8_ = this;
  CVar1._32_8_ = p_Var8;
  testing::internal::MakeAndRegisterTestInfo
            (pcVar9,pcVar3,pcVar4,(char *)0x0,CVar1,&local_178,p_Var5,p_Var5,pTVar7);
  CodeLocation::~CodeLocation(&local_178);
  std::__cxx11::string::~string((string *)&local_150);
  std::__cxx11::string::~string((string *)&local_110);
  std::__cxx11::string::~string((string *)&local_130);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&local_b8);
  std::__cxx11::string::~string((string *)&local_d8);
  std::allocator<char>::~allocator(&local_d9);
  bVar2 = TypeParameterizedTest<WordSplitStringTest,_testing::internal::TemplateSel<WordSplitStringTest_single_word_long_Test>,_testing::internal::Types<char8_t,_char16_t,_char32_t>_>
          ::Register((char *)code_location_local,(CodeLocation *)case_name_local,test_names_local,
                     (char *)piStack_28,type_names_local._4_4_ + 1,local_38);
  return bVar2;
}

Assistant:

static bool Register(const char* prefix, const CodeLocation& code_location,
                       const char* case_name, const char* test_names, int index,
                       const std::vector<std::string>& type_names =
                           GenerateNames<DefaultNameGenerator, Types>()) {
    typedef typename Types::Head Type;
    typedef Fixture<Type> FixtureClass;
    typedef typename GTEST_BIND_(TestSel, Type) TestClass;

    // First, registers the first type-parameterized test in the type
    // list.
    MakeAndRegisterTestInfo(
        (std::string(prefix) + (prefix[0] == '\0' ? "" : "/") + case_name +
         "/" + type_names[static_cast<size_t>(index)])
            .c_str(),
        StripTrailingSpaces(GetPrefixUntilComma(test_names)).c_str(),
        GetTypeName<Type>().c_str(),
        nullptr,  // No value parameter.
        code_location, GetTypeId<FixtureClass>(),
        SuiteApiResolver<TestClass>::GetSetUpCaseOrSuite(
            code_location.file.c_str(), code_location.line),
        SuiteApiResolver<TestClass>::GetTearDownCaseOrSuite(
            code_location.file.c_str(), code_location.line),
        new TestFactoryImpl<TestClass>);

    // Next, recurses (at compile time) with the tail of the type list.
    return TypeParameterizedTest<Fixture, TestSel,
                                 typename Types::Tail>::Register(prefix,
                                                                 code_location,
                                                                 case_name,
                                                                 test_names,
                                                                 index + 1,
                                                                 type_names);
  }